

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O3

void __thiscall
wasm::WATParser::ParseTypeDefsCtx::addStructType(ParseTypeDefsCtx *this,StructT *type)

{
  char *pcVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  pointer pNVar4;
  pointer pNVar5;
  uint uVar6;
  key_type local_34;
  ulong uVar7;
  
  TypeBuilder::setHeapType(this->builder,(ulong)this->index,&type->second);
  local_34 = 0;
  pNVar4 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar5 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar5 != pNVar4) {
    uVar7 = 0;
    do {
      pcVar1 = pNVar4[uVar7].super_IString.str._M_str;
      uVar6 = (uint)uVar7;
      if (pcVar1 != (char *)0x0) {
        sVar2 = pNVar4[uVar7].super_IString.str._M_len;
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&(this->names).
                                  super__Vector_base<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>
                                  ._M_impl.super__Vector_impl_data._M_start[this->index].fieldNames,
                              &local_34);
        (pmVar3->super_IString).str._M_len = sVar2;
        (pmVar3->super_IString).str._M_str = pcVar1;
        pNVar4 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar5 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar6 = local_34;
      }
      local_34 = uVar6 + 1;
      uVar7 = (ulong)local_34;
    } while (uVar7 < (ulong)((long)pNVar5 - (long)pNVar4 >> 4));
  }
  return;
}

Assistant:

void addStructType(StructT& type) {
    auto& [fieldNames, str] = type;
    builder[index] = str;
    for (Index i = 0; i < fieldNames.size(); ++i) {
      if (auto name = fieldNames[i]; name.is()) {
        names[index].fieldNames[i] = name;
      }
    }
  }